

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t.h
# Opt level: O1

uintwide_t<2048U,_unsigned_int,_std::allocator<unsigned_int>,_false> * __thiscall
math::wide_integer::detail::
abs_unsafe<math::wide_integer::uintwide_t<2048u,unsigned_int,std::allocator<unsigned_int>,false>>
          (uintwide_t<2048U,_unsigned_int,_std::allocator<unsigned_int>,_false>
           *__return_storage_ptr__,detail *this,
          uintwide_t<2048U,_unsigned_int,_std::allocator<unsigned_int>,_false> *val)

{
  enable_if_t<std::is_integral<int>::value,_bool> eVar1;
  uintwide_t<2048U,_unsigned_int,_std::allocator<unsigned_int>,_false> *val_unsigned;
  int local_1c;
  
  local_1c = 0;
  eVar1 = operator>((uintwide_t<2048U,_unsigned_int,_std::allocator<unsigned_int>,_false> *)this,
                    &local_1c);
  util::dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>::dynamic_array
            ((dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int> *)
             __return_storage_ptr__,
             (dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int> *)this);
  (__return_storage_ptr__->values).
  super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>.
  _vptr_dynamic_array = (_func_int **)&PTR__dynamic_array_00211c38;
  if (!eVar1) {
    uintwide_t<2048U,_unsigned_int,_std::allocator<unsigned_int>,_false>::negate
              (__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

constexpr auto abs_unsafe(const ArithmeticType& val) -> ArithmeticType
  {
    if(val > static_cast<int>(INT8_C(0)))
    {
      return val;
    }
    else // NOLINT(llvm-else-after-return,readability-else-after-return)
    {
      ArithmeticType val_unsigned { val };

      val_unsigned.negate();

      return val_unsigned;
    }
  }